

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab)

{
  int iVar1;
  undefined1 local_50 [8];
  Walker w;
  Expr *pEStack_18;
  int iTab_local;
  Expr *p_local;
  
  w.u._4_4_ = iTab;
  pEStack_18 = sqlite3ExprSkipCollate(p);
  while (pEStack_18 != (Expr *)0x0) {
    if (pEStack_18->op == '3') {
      pEStack_18 = pEStack_18->pLeft;
    }
    else {
      if (pEStack_18->op != ',') break;
      iVar1 = sqlite3ExprImpliesNonNullRow(pEStack_18->pLeft,w.u._4_4_);
      if (iVar1 != 0) {
        return 1;
      }
      pEStack_18 = pEStack_18->pRight;
    }
  }
  w.pParse = (Parse *)impliesNotNullRow;
  w.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
  w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  w.xSelectCallback2._4_1_ = 0;
  w.walkerDepth = w.u._4_4_;
  sqlite3WalkExpr((Walker *)local_50,pEStack_18);
  return (uint)w.xSelectCallback2._4_1_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab){
  Walker w;
  p = sqlite3ExprSkipCollate(p);
  while( p ){
    if( p->op==TK_NOTNULL ){
      p = p->pLeft;
    }else if( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab) ) return 1;
      p = p->pRight;
    }else{
      break;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}